

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chainparams.cpp
# Opt level: O0

vector<int,_std::allocator<int>_> * __thiscall
CChainParams::GetAvailableSnapshotHeights(CChainParams *this)

{
  long lVar1;
  bool bVar2;
  int *in_RSI;
  vector<int,_std::allocator<int>_> *in_RDI;
  long in_FS_OFFSET;
  AssumeutxoData *data;
  vector<AssumeutxoData,_std::allocator<AssumeutxoData>_> *__range1;
  vector<int,_std::allocator<int>_> *heights;
  const_iterator __end1;
  const_iterator __begin1;
  vector<AssumeutxoData,_std::allocator<AssumeutxoData>_> *in_stack_ffffffffffffff88;
  vector<AssumeutxoData,_std::allocator<AssumeutxoData>_> *in_stack_ffffffffffffff90;
  vector<int,_std::allocator<int>_> *this_00;
  size_type in_stack_ffffffffffffffc0;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffffc8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff88);
  std::vector<AssumeutxoData,_std::allocator<AssumeutxoData>_>::size(in_stack_ffffffffffffff88);
  std::vector<int,_std::allocator<int>_>::reserve
            (in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  std::vector<AssumeutxoData,_std::allocator<AssumeutxoData>_>::begin(in_stack_ffffffffffffff90);
  std::vector<AssumeutxoData,_std::allocator<AssumeutxoData>_>::end(in_stack_ffffffffffffff90);
  while (bVar2 = __gnu_cxx::
                 operator==<const_AssumeutxoData_*,_std::vector<AssumeutxoData,_std::allocator<AssumeutxoData>_>_>
                           ((__normal_iterator<const_AssumeutxoData_*,_std::vector<AssumeutxoData,_std::allocator<AssumeutxoData>_>_>
                             *)in_RDI,
                            (__normal_iterator<const_AssumeutxoData_*,_std::vector<AssumeutxoData,_std::allocator<AssumeutxoData>_>_>
                             *)in_stack_ffffffffffffff90), ((bVar2 ^ 0xffU) & 1) != 0) {
    __gnu_cxx::
    __normal_iterator<const_AssumeutxoData_*,_std::vector<AssumeutxoData,_std::allocator<AssumeutxoData>_>_>
    ::operator*((__normal_iterator<const_AssumeutxoData_*,_std::vector<AssumeutxoData,_std::allocator<AssumeutxoData>_>_>
                 *)in_stack_ffffffffffffff88);
    std::vector<int,std::allocator<int>>::emplace_back<int_const&>(this_00,in_RSI);
    __gnu_cxx::
    __normal_iterator<const_AssumeutxoData_*,_std::vector<AssumeutxoData,_std::allocator<AssumeutxoData>_>_>
    ::operator++((__normal_iterator<const_AssumeutxoData_*,_std::vector<AssumeutxoData,_std::allocator<AssumeutxoData>_>_>
                  *)in_stack_ffffffffffffff88);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

std::vector<int> CChainParams::GetAvailableSnapshotHeights() const
{
    std::vector<int> heights;
    heights.reserve(m_assumeutxo_data.size());

    for (const auto& data : m_assumeutxo_data) {
        heights.emplace_back(data.height);
    }
    return heights;
}